

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libtlp.c
# Opt level: O0

int nettlp_create_udp_socket
              (in_addr remote_addr,uint16_t remote_port,in_addr local_addr,uint16_t local_port)

{
  uint16_t in_CX;
  undefined4 in_EDX;
  uint16_t in_SI;
  undefined4 in_EDI;
  sockaddr_in saddr;
  int ret;
  int fd;
  sockaddr local_28;
  int local_18;
  int local_14;
  uint16_t local_10;
  uint16_t local_e;
  char local_c [4];
  char local_8 [4];
  int local_4;
  
  local_10 = in_CX;
  local_e = in_SI;
  local_c = (char  [4])in_EDX;
  local_8 = (char  [4])in_EDI;
  local_14 = socket(2,2,0x11);
  local_4 = local_14;
  if (-1 < local_14) {
    memset(&local_28,0,0x10);
    local_28.sa_family = 2;
    local_28.sa_data[2] = local_c[0];
    local_28.sa_data[3] = local_c[1];
    local_28.sa_data[4] = local_c[2];
    local_28.sa_data[5] = local_c[3];
    local_28.sa_data._0_2_ = htons(local_10);
    local_18 = bind(local_14,&local_28,0x10);
    local_4 = local_18;
    if (-1 < local_18) {
      memset(&local_28,0,0x10);
      local_28.sa_family = 2;
      local_28.sa_data[2] = local_8[0];
      local_28.sa_data[3] = local_8[1];
      local_28.sa_data[4] = local_8[2];
      local_28.sa_data[5] = local_8[3];
      local_28.sa_data._0_2_ = htons(local_e);
      local_4 = connect(local_14,&local_28,0x10);
      if (-1 < local_4) {
        local_4 = local_14;
      }
    }
  }
  return local_4;
}

Assistant:

static int nettlp_create_udp_socket(struct in_addr remote_addr,
				    uint16_t remote_port,
				    struct in_addr local_addr,
				    uint16_t local_port)
{
	int fd, ret;
	struct sockaddr_in saddr;

	fd = socket(AF_INET, SOCK_DGRAM, IPPROTO_UDP);
	if (fd < 0)
		return fd;

	/* bind to local address */
	memset(&saddr, 0, sizeof(saddr));
	saddr.sin_family = AF_INET;
	saddr.sin_addr = local_addr;
	saddr.sin_port = htons(local_port);
	ret = bind(fd, (struct sockaddr *)&saddr, sizeof(saddr));
	if (ret < 0)
		return ret;
	
	/* connect to remote address */
	memset(&saddr, 0, sizeof(saddr));
	saddr.sin_family = AF_INET;
	saddr.sin_addr = remote_addr;
	saddr.sin_port = htons(remote_port);
	ret = connect(fd, (struct sockaddr *)&saddr, sizeof(saddr));
	if (ret < 0)
		return ret;

	return fd;
}